

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_map.h
# Opt level: O2

void __thiscall cppcms::impl::string_pool::add_page(string_pool *this)

{
  size_t sVar1;
  page *ppVar2;
  undefined8 *puVar3;
  
  sVar1 = this->page_size_;
  ppVar2 = (page *)malloc(sVar1 + 0x10);
  if (ppVar2 != (page *)0x0) {
    ppVar2->next = this->pages_;
    this->pages_ = ppVar2;
    this->data_ = ppVar2->data;
    this->free_space_ = sVar1;
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = &std::cout;
  __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void add_page()
			{
				page *p=(page *)malloc(sizeof(page) + page_size_);
				if(!p)
					throw std::bad_alloc();
				p->next = pages_;
				pages_ = p;
				data_ = p->data;
				free_space_ = page_size_;
			}